

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall
xray_re::cse_alife_object::state_read(cse_alife_object *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = (this->super_cse_abstract).m_version;
  if (uVar1 != 0) {
    if (uVar1 < 0x19) {
      xr_packet::r<signed_char>(packet);
    }
    else if (uVar1 < 0x53) {
      xr_packet::r<float>(packet);
    }
    if ((this->super_cse_abstract).m_version < 0x53) {
      xr_packet::r<int>(packet);
      if ((this->super_cse_abstract).m_version < 4) {
        xr_packet::r<unsigned_short>(packet);
      }
    }
    xr_packet::r<unsigned_short>(packet,&this->m_graph_id);
    xr_packet::r<float>(packet,&this->m_distance);
    uVar1 = (this->super_cse_abstract).m_version;
    if (3 < uVar1) {
      uVar2 = xr_packet::r<unsigned_int>(packet);
      this->m_direct_control = (bool)((byte)uVar2 & 1);
      uVar1 = (this->super_cse_abstract).m_version;
      if (7 < uVar1) {
        xr_packet::r<unsigned_int>(packet,&this->m_node_id);
        uVar1 = (this->super_cse_abstract).m_version;
      }
    }
    if ((ushort)(uVar1 - 0x17) < 0x39) {
      xr_packet::r<unsigned_short>(packet,&(this->super_cse_abstract).m_spawn_id);
      uVar1 = (this->super_cse_abstract).m_version;
    }
    if ((ushort)(uVar1 - 0x18) < 0x3c) {
      xr_packet::skip_sz(packet);
      uVar1 = (this->super_cse_abstract).m_version;
    }
    if (0x31 < uVar1) {
      xr_packet::r<unsigned_int>(packet,&this->m_flags);
      if (0x39 < (this->super_cse_abstract).m_version) {
        xr_packet::r_sz(packet,&(this->super_cse_abstract).m_ini_string);
        if (0x3d < (this->super_cse_abstract).m_version) {
          xr_packet::r<unsigned_int>(packet,&this->m_story_id);
          if (0x6f < (this->super_cse_abstract).m_version) {
            xr_packet::r<unsigned_int>(packet,&this->m_spawn_story_id);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cse_alife_object::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version >= CSE_VERSION_0x01) {
		if (m_version <= CSE_VERSION_0x18)
			packet.r_s8();
		else if (m_version < CSE_VERSION_0x53)
			packet.r_float();
		if (m_version < CSE_VERSION_0x53)
			packet.r_s32();
		if (m_version < CSE_VERSION_0x04)
			packet.r_u16();
		packet.r_u16(m_graph_id);
		packet.r_float(m_distance);
	}
	if (m_version >= CSE_VERSION_0x04)
		m_direct_control = (packet.r_u32() & 1) != 0;
	if (m_version >= CSE_VERSION_0x08)
		packet.r_u32(m_node_id);
	if (m_version > CSE_VERSION_0x16 && m_version <= CSE_VERSION_0x4f)
		packet.r_u16(m_spawn_id);
	if (m_version > CSE_VERSION_0x17 && m_version < CSE_VERSION_0x54)
		packet.skip_sz();
	if (m_version > CSE_VERSION_0x31)
		packet.r_u32(m_flags);
	if (m_version > CSE_VERSION_0x39)
		packet.r_sz(m_ini_string);
	if (m_version > CSE_VERSION_0x3d)
		packet.r_u32(m_story_id);
	if (m_version > CSE_VERSION_0x6f)
		packet.r_u32(m_spawn_story_id);
}